

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_vector_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states
          (storage_t *this,mbox_t *mbox,type_index *msg_type)

{
  anon_class_16_2_64d98173_for__M_pred __pred;
  size_type sVar1;
  mbox_id_t mVar2;
  int iVar3;
  abstract_message_box_t *paVar4;
  undefined4 extraout_var;
  size_type sVar5;
  agent_t *paVar6;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  local_70;
  const_iterator local_68;
  size_type local_60;
  mbox_id_t local_58;
  subscr_info_t *local_50;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  local_48;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  local_40;
  const_iterator local_38;
  size_type local_30;
  size_type old_size;
  mbox_id_t mbox_id;
  type_index *msg_type_local;
  mbox_t *mbox_local;
  storage_t *this_local;
  
  mbox_id = (mbox_id_t)msg_type;
  msg_type_local = (type_index *)mbox;
  mbox_local = (mbox_t *)this;
  paVar4 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(mbox);
  iVar3 = (*paVar4->_vptr_abstract_message_box_t[2])();
  old_size = CONCAT44(extraout_var,iVar3);
  local_30 = std::
             vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
             ::size(&this->m_events);
  local_48._M_current =
       (subscr_info_t *)
       std::
       begin<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                 (&this->m_events);
  local_50 = (subscr_info_t *)
             std::
             end<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                       (&this->m_events);
  local_60 = old_size;
  local_58 = mbox_id;
  __pred.msg_type = (type_index *)mbox_id;
  __pred.mbox_id = old_size;
  local_40 = std::
             remove_if<__gnu_cxx::__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>,so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                       (local_48,(__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
                                  )local_50,__pred);
  __gnu_cxx::
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_const*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
  ::__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t*>
            ((__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_const*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
              *)&local_38,&local_40);
  local_70._M_current =
       (subscr_info_t *)
       std::
       end<std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
                 (&this->m_events);
  __gnu_cxx::
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_const*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
  ::__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t*>
            ((__normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_const*,std::vector<so_5::impl::subscription_storage_common::subscr_info_t,std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>>>
              *)&local_68,&local_70);
  std::
  vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
  ::erase(&this->m_events,local_38,local_68);
  sVar1 = local_30;
  sVar5 = std::
          vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
          ::size(&this->m_events);
  if (sVar1 != sVar5) {
    paVar4 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->
                       ((intrusive_ptr_t<so_5::abstract_message_box_t> *)msg_type_local);
    mVar2 = mbox_id;
    paVar6 = subscription_storage_t::owner(&this->super_subscription_storage_t);
    (*paVar4->_vptr_abstract_message_box_t[4])(paVar4,mVar2,paVar6);
  }
  return;
}

Assistant:

void
storage_t::drop_subscription_for_all_states(
	const mbox_t & mbox,
	const std::type_index & msg_type )
	{
		using namespace std;

		const auto mbox_id = mbox->id();

		const auto old_size = m_events.size();

		m_events.erase(
				remove_if( begin( m_events ), end( m_events ),
						[mbox_id, &msg_type]( const info_t & i ) {
							return i.m_mbox->id() == mbox_id &&
									i.m_msg_type == msg_type;
						} ),
				end( m_events ) );

		// Note: since v.5.5.9 mbox unsubscription is initiated even if
		// it is MPSC mboxes. It is important for the case of message
		// delivery tracing.

		if( old_size != m_events.size() )
			mbox->unsubscribe_event_handlers( msg_type, owner() );
	}